

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint __thiscall
ON_SubDMeshFragmentIterator::TotalQuadCount(ON_SubDMeshFragmentIterator *this,uint mesh_density)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  uint half_size_fragment_count;
  uint full_size_fragment_count;
  
  uVar1 = ClampMeshDensity(this,mesh_density);
  _half_size_fragment_count = 0;
  GetFragmentCounts(this,&full_size_fragment_count,&half_size_fragment_count);
  iVar4 = (1 << ((byte)uVar1 & 0x1f)) << ((byte)uVar1 & 0x1f);
  if (6 < uVar1) {
    iVar4 = 0;
  }
  bVar3 = (byte)(uVar1 - 1);
  iVar2 = (1 << (bVar3 & 0x1f)) << (bVar3 & 0x1f);
  if (5 < uVar1 - 1) {
    iVar2 = 0;
  }
  return iVar2 * half_size_fragment_count + iVar4 * full_size_fragment_count;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::TotalQuadCount(
  unsigned int mesh_density
  ) const
{
  mesh_density = ClampMeshDensity(mesh_density);
  unsigned int full_size_fragment_count = 0;
  unsigned int half_size_fragment_count = 0;
  ON_SubDMeshFragmentIterator::GetFragmentCounts(full_size_fragment_count, half_size_fragment_count);
  const unsigned int full_size_quad_count = ON_SubDMeshFragment::FullFragmentMeshQuadCountFromDensity(mesh_density);
  const unsigned int half_size_quad_count = ON_SubDMeshFragment::HalfFragmentMeshQuadCountFromDensity(mesh_density);
  return full_size_fragment_count * full_size_quad_count + half_size_fragment_count * half_size_quad_count;
}